

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O0

void __thiscall MxxReduce_ReduceOne_Test::TestBody(MxxReduce_ReduceOne_Test *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  AssertHelper local_240;
  Message local_238;
  int local_22c;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_9;
  Message local_210;
  int local_204;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_8;
  int u;
  int v;
  Message local_1e0;
  float local_1d4;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_7;
  Message local_1b8;
  float local_1ac;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_6;
  float local_190;
  float local_18c;
  float m;
  Message local_180;
  int local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_5;
  Message local_158;
  int local_14c;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_4;
  undefined4 local_110;
  int local_10c;
  int g;
  Message local_100;
  int local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_3;
  Message local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_2;
  undefined4 local_b0;
  int local_ac;
  int z;
  Message local_a0;
  int local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_78;
  Message local_70;
  int local_64;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  int local_48 [2];
  int y;
  int local_34;
  undefined1 local_30 [4];
  int x;
  comm c;
  MxxReduce_ReduceOne_Test *this_local;
  
  c._24_8_ = this;
  mxx::comm::comm((comm *)local_30);
  iVar2 = mxx::comm::size((comm *)local_30);
  iVar3 = mxx::comm::rank((comm *)local_30);
  local_34 = (iVar2 - iVar3) * -0xd;
  iVar2 = mxx::comm::size((comm *)local_30);
  local_48[0] = mxx::reduce<int,mxx::min<int>>(&local_34,iVar2 / 2,local_30);
  iVar2 = mxx::comm::rank((comm *)local_30);
  iVar3 = mxx::comm::size((comm *)local_30);
  if (iVar2 == iVar3 / 2) {
    local_64 = mxx::comm::size((comm *)local_30);
    local_64 = local_64 * -0xd;
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_60,"-13*c.size()","y",&local_64,local_48);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
    if (!bVar1) {
      testing::Message::Message(&local_70);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                 ,0x7e,pcVar4);
      testing::internal::AssertHelper::operator=(&local_78,&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      testing::Message::~Message(&local_70);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  }
  else {
    local_94 = 0;
    testing::internal::EqHelper<true>::Compare<int,int>
              (local_90,"0",(int *)0x1c195e,&local_94,local_48);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_a0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffff58,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                 ,0x80,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff58,&local_a0)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff58);
      testing::Message::~Message(&local_a0);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  }
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_b0 = 3;
    local_ac = mxx::reduce<int,std::plus<int>>(&local_b0,0,local_30);
    iVar2 = mxx::comm::rank((comm *)local_30);
    if (iVar2 == 0) {
      local_cc = mxx::comm::size((comm *)local_30);
      local_cc = local_cc * 3;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_c8,"3*c.size()","z",&local_cc,&local_ac);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                   ,0x85,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_d8);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
    }
    else {
      local_f4 = 0;
      testing::internal::EqHelper<true>::Compare<int,int>
                (local_f0,"0",(int *)"z",&local_f4,&local_ac);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
      if (!bVar1) {
        testing::Message::Message(&local_100);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffef8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                   ,0x87,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffef8,&local_100);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffef8);
        testing::Message::~Message(&local_100);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
    }
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      local_110 = 2;
      iVar2 = mxx::comm::size((comm *)local_30);
      mxx::comm::comm((comm *)&gtest_ar_4.message_);
      iVar2 = mxx::reduce<int,MxxReduce_ReduceOne_Test::TestBody()::__0>
                        (&local_110,iVar2 + -1,&gtest_ar_4.message_);
      mxx::comm::~comm((comm *)&gtest_ar_4.message_);
      local_10c = iVar2;
      iVar2 = mxx::comm::rank((comm *)local_30);
      iVar3 = mxx::comm::size((comm *)local_30);
      if (iVar2 == iVar3 + -1) {
        local_14c = mxx::comm::size((comm *)local_30);
        local_14c = local_14c * 2;
        testing::internal::EqHelper<false>::Compare<int,int>
                  ((EqHelper<false> *)local_148,"2*c.size()","g",&local_14c,&local_10c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
        if (!bVar1) {
          testing::Message::Message(&local_158);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                     ,0x8c,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_5.message_,&local_158);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
          testing::Message::~Message(&local_158);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
      }
      else {
        local_174 = 0;
        testing::internal::EqHelper<true>::Compare<int,int>
                  (local_170,"0",(int *)0x1bb9ae,&local_174,&local_10c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
        if (!bVar1) {
          testing::Message::Message(&local_180);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xfffffffffffffe78,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                     ,0x8e,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xfffffffffffffe78,&local_180);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe78);
          testing::Message::~Message(&local_180);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
      }
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        iVar2 = mxx::comm::rank((comm *)local_30);
        local_190 = (float)iVar2 * 1.3333;
        local_18c = mxx::reduce<float,mymax<float>>(&local_190,0,local_30);
        iVar2 = mxx::comm::rank((comm *)local_30);
        if (iVar2 == 0) {
          iVar2 = mxx::comm::size((comm *)local_30);
          local_1ac = (float)(iVar2 + -1) * 1.3333;
          testing::internal::EqHelper<false>::Compare<float,float>
                    ((EqHelper<false> *)local_1a8,"1.3333f*(c.size()-1)","m",&local_1ac,&local_18c);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
          if (!bVar1) {
            testing::Message::Message(&local_1b8);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                       ,0x93,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_7.message_,&local_1b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
            testing::Message::~Message(&local_1b8);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
        }
        else {
          local_1d4 = 0.0;
          testing::internal::EqHelper<true>::Compare<int,float>
                    (local_1d0,"0",(int *)0x1c1b5b,&local_1d4,&local_18c);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
          if (!bVar1) {
            testing::Message::Message(&local_1e0);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&u,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                       ,0x95,pcVar4);
            testing::internal::AssertHelper::operator=((AssertHelper *)&u,&local_1e0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&u);
            testing::Message::~Message(&local_1e0);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
        }
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          iVar2 = mxx::comm::rank((comm *)local_30);
          gtest_ar_8.message_.ptr_._4_4_ = iVar2 + 1;
          gtest_ar_8.message_.ptr_._0_4_ =
               mxx::reduce<int,int(*)(int,int)>
                         ((int *)((long)&gtest_ar_8.message_.ptr_ + 4),0,mymin,(comm *)local_30);
          iVar2 = mxx::comm::rank((comm *)local_30);
          if (iVar2 == 0) {
            local_204 = 1;
            testing::internal::EqHelper<false>::Compare<int,int>
                      ((EqHelper<false> *)local_200,"1","u",&local_204,(int *)&gtest_ar_8.message_);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
            if (!bVar1) {
              testing::Message::Message(&local_210);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                         ,0x9b,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_9.message_,&local_210);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
              testing::Message::~Message(&local_210);
            }
            gtest_ar_1.message_.ptr_._5_3_ = 0;
            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
          }
          else {
            local_22c = 0;
            testing::internal::EqHelper<true>::Compare<int,int>
                      (local_228,"0",(int *)0x1bb3c0,&local_22c,&gtest_ar_8.message_);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
            if (!bVar1) {
              testing::Message::Message(&local_238);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
              testing::internal::AssertHelper::AssertHelper
                        (&local_240,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                         ,0x9d,pcVar4);
              testing::internal::AssertHelper::operator=(&local_240,&local_238);
              testing::internal::AssertHelper::~AssertHelper(&local_240);
              testing::Message::~Message(&local_238);
            }
            gtest_ar_1.message_.ptr_._5_3_ = 0;
            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
          }
          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
            gtest_ar_1.message_.ptr_._4_4_ = 0;
          }
        }
      }
    }
  }
  mxx::comm::~comm((comm *)local_30);
  return;
}

Assistant:

TEST(MxxReduce, ReduceOne) {
    mxx::comm c = mxx::comm();

    // test min
    int x = -13*(c.size() - c.rank());
    int y = mxx::reduce(x, c.size()/2, mxx::min<int>(), c);
    if (c.rank() == c.size()/2) {
        ASSERT_EQ(-13*c.size(), y);
    } else {
        ASSERT_EQ(0, y);
    }
    // test sum
    int z = mxx::reduce(3, 0, std::plus<int>(), c);
    if (c.rank() == 0) {
        ASSERT_EQ(3*c.size(), z);
    } else {
        ASSERT_EQ(0, z);
    }
    // test lambda op
    int g = mxx::reduce(2, c.size()-1, [](int i, int j){return i+j;});
    if (c.rank() == c.size()-1) {
        ASSERT_EQ(2*c.size(), g);
    } else {
        ASSERT_EQ(0, g);
    }
    // test functor
    float m = mxx::reduce(1.3333f*c.rank(), 0, mymax<float>(), c);
    if (c.rank() == 0) {
        ASSERT_EQ(1.3333f*(c.size()-1), m);
    } else {
        ASSERT_EQ(0, m);
    }
    // test own function pointer
    int v = c.rank() + 1;
    int u = mxx::reduce(v, 0, mymin, c);
    if (c.rank() == 0) {
        ASSERT_EQ(1, u);
    } else {
        ASSERT_EQ(0, u);
    }
}